

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O3

int delete(int argc,char **argv)

{
  int iVar1;
  ulonglong uVar2;
  int iVar3;
  
  iVar3 = 0;
  uVar2 = strtoull(*argv,(char **)0x0,10);
  iVar1 = zip_delete(za,uVar2);
  if (iVar1 < 0) {
    delete_cold_1();
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int delete (int argc, char *argv[]) {
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    if (zip_delete(za, idx) < 0) {
	fprintf(stderr, "can't delete file at index '%" PRIu64 "': %s\n", idx, zip_strerror(za));
	return -1;
    }
    return 0;
}